

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O2

Vector3 Vector3Normalize(Vector3 v)

{
  uint uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  Vector3 VVar6;
  
  fVar4 = v.z;
  fVar2 = v.x;
  fVar3 = v.y;
  fVar5 = SQRT(fVar4 * fVar4 + fVar2 * fVar2 + fVar3 * fVar3);
  uVar1 = -(uint)(fVar5 == 0.0);
  fVar5 = (float)(uVar1 & 0x3f800000 | ~uVar1 & (uint)(1.0 / fVar5));
  VVar6.z = fVar4 * fVar5;
  VVar6.x = fVar2 * fVar5;
  VVar6.y = fVar3 * fVar5;
  return VVar6;
}

Assistant:

RMDEF Vector3 Vector3Normalize(Vector3 v)
{
    Vector3 result = v;

    float length, ilength;
    length = Vector3Length(v);
    if (length == 0.0f) length = 1.0f;
    ilength = 1.0f/length;

    result.x *= ilength;
    result.y *= ilength;
    result.z *= ilength;

    return result;
}